

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O1

bool __thiscall Turn::addNurse(Turn *this,NurseSolution *nurse)

{
  pointer *pppNVar1;
  NurseSolution **ppNVar2;
  iterator __position;
  __normal_iterator<NurseSolution_**,_std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>_>
  _Var3;
  NurseSolution *local_28;
  NurseSolution *local_20;
  
  local_28 = nurse;
  local_20 = nurse;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,__gnu_cxx::__ops::_Iter_equals_val<NurseSolution_const*const>>
                    ((this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  ppNVar2 = (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current == ppNVar2) {
    __position._M_current =
         (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<NurseSolution*,std::allocator<NurseSolution*>>::
      _M_realloc_insert<NurseSolution*const&>
                ((vector<NurseSolution*,std::allocator<NurseSolution*>> *)&this->nurses,__position,
                 &local_28);
    }
    else {
      *__position._M_current = local_28;
      pppNVar1 = &(this->nurses).
                  super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    NurseSolution::addTurn(local_28,this);
  }
  return _Var3._M_current == ppNVar2;
}

Assistant:

bool Turn::addNurse(NurseSolution * nurse){
    if(!hasNurse(nurse)) {
        nurses.push_back(nurse);
        nurse->addTurn(this);
        return true;
    }
    return false;
}